

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_set_fixed_partitioning
               (AV1_COMP *cpi,TileInfo *tile,MB_MODE_INFO **mib,int mi_row,int mi_col,
               BLOCK_SIZE bsize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int bh;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  undefined7 in_register_00000089;
  int iVar16;
  int iVar17;
  int mi_alloc_size_1d;
  int bw;
  uint uVar18;
  
  iVar6 = tile->mi_row_end - mi_row;
  iVar16 = tile->mi_col_end - mi_col;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [(cpi->common).mi_params.mi_alloc_bsize];
  iVar3 = (cpi->common).mi_params.mi_alloc_stride;
  iVar10 = (mi_row / (int)(uint)bVar1) * iVar3 + mi_col / (int)(uint)bVar1;
  uVar14 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar14]
  ;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar14];
  iVar15 = ((cpi->common).seq_params)->mib_size;
  pMVar4 = (cpi->common).mi_params.mi_alloc;
  if (iVar6 < iVar15 || iVar16 < iVar15) {
    uVar12 = 3;
    if (bsize < 3) {
      uVar12 = (uint)bsize;
    }
    for (iVar11 = 0; iVar11 < iVar15; iVar11 = iVar11 + uVar9) {
      iVar17 = iVar6 - iVar11;
      uVar18 = (uint)bVar2;
      for (iVar13 = 0; iVar13 < iVar15; iVar13 = iVar13 + uVar18) {
        mib[(cpi->common).mi_params.mi_stride * iVar11 + iVar13] =
             pMVar4 + (long)iVar10 +
                      (long)((iVar11 / (int)(uint)bVar1) * iVar3 + iVar13 / (int)(uint)bVar1);
        uVar8 = uVar12;
        if ((0 < iVar17) && (iVar15 = iVar16 - iVar13, uVar7 = (uint)bsize, 0 < iVar15)) {
          for (; uVar8 = uVar7, 0 < (int)uVar7; uVar7 = uVar7 - 3) {
            uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [uVar7];
            uVar18 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [uVar7];
            if (((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [uVar7] <= iVar17) &&
               ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [uVar7] <= iVar15)) break;
          }
        }
        pMVar4[(long)iVar10 +
               (long)((iVar11 / (int)(uint)bVar1) * iVar3 + iVar13 / (int)(uint)bVar1)].bsize =
             (BLOCK_SIZE)uVar8;
        iVar15 = ((cpi->common).seq_params)->mib_size;
      }
    }
  }
  else {
    for (uVar12 = 0; (int)uVar12 < iVar15; uVar12 = uVar12 + uVar9) {
      for (uVar14 = 0; (int)uVar14 < iVar15; uVar14 = uVar14 + (uint)bVar2) {
        lVar5 = (long)(int)((uVar12 / bVar1) * iVar3 + (int)((uVar14 & 0xffffffff) / (ulong)bVar1));
        mib[(long)(cpi->common).mi_params.mi_stride * (long)(int)uVar12 + uVar14] =
             pMVar4 + iVar10 + lVar5;
        pMVar4[iVar10 + lVar5].bsize = bsize;
        iVar15 = ((cpi->common).seq_params)->mib_size;
      }
    }
  }
  return;
}

Assistant:

void av1_set_fixed_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                MB_MODE_INFO **mib, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_rows_remaining = tile->mi_row_end - mi_row;
  const int mi_cols_remaining = tile->mi_col_end - mi_col;
  MB_MODE_INFO *const mi_upper_left =
      mi_params->mi_alloc + get_alloc_mi_idx(mi_params, mi_row, mi_col);
  int bh = mi_size_high[bsize];
  int bw = mi_size_wide[bsize];

  assert(bsize >= mi_params->mi_alloc_bsize &&
         "Attempted to use bsize < mi_params->mi_alloc_bsize");
  assert((mi_rows_remaining > 0) && (mi_cols_remaining > 0));

  // Apply the requested partition size to the SB if it is all "in image"
  if ((mi_cols_remaining >= cm->seq_params->mib_size) &&
      (mi_rows_remaining >= cm->seq_params->mib_size)) {
    for (int block_row = 0; block_row < cm->seq_params->mib_size;
         block_row += bh) {
      for (int block_col = 0; block_col < cm->seq_params->mib_size;
           block_col += bw) {
        const int grid_index = get_mi_grid_idx(mi_params, block_row, block_col);
        const int mi_index = get_alloc_mi_idx(mi_params, block_row, block_col);
        mib[grid_index] = mi_upper_left + mi_index;
        mib[grid_index]->bsize = bsize;
      }
    }
  } else {
    // Else this is a partial SB.
    set_partial_sb_partition(cm, mi_upper_left, bh, bw, mi_rows_remaining,
                             mi_cols_remaining, bsize, mib);
  }
}